

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.hpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine::
shaderCollectionForSamplingRoutine(shaderCollectionForSamplingRoutine *this)

{
  (this->pass_through_vertex_shader).m_gl = (Functions *)0x0;
  (this->pass_through_vertex_shader).m_shader_stage = 0;
  (this->pass_through_vertex_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->pass_through_vertex_shader).m_source.field_2;
  (this->pass_through_vertex_shader).m_source._M_string_length = 0;
  (this->pass_through_vertex_shader).m_source.field_2._M_local_buf[0] = '\0';
  (this->pass_through_vertex_shader).m_shader_object_id = 0;
  (this->pass_through_tesselation_control_shader).m_gl = (Functions *)0x0;
  (this->pass_through_tesselation_control_shader).m_shader_stage = 0;
  (this->pass_through_tesselation_control_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->pass_through_tesselation_control_shader).m_source.field_2;
  (this->pass_through_tesselation_control_shader).m_source._M_string_length = 0;
  (this->pass_through_tesselation_control_shader).m_source.field_2._M_local_buf[0] = '\0';
  (this->pass_through_tesselation_control_shader).m_shader_object_id = 0;
  (this->sampling_compute_shader).m_gl = (Functions *)0x0;
  (this->sampling_compute_shader).m_shader_stage = 0;
  (this->sampling_compute_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->sampling_compute_shader).m_source.field_2;
  (this->sampling_compute_shader).m_source._M_string_length = 0;
  (this->sampling_compute_shader).m_source.field_2._M_local_buf[0] = '\0';
  (this->sampling_compute_shader).m_shader_object_id = 0;
  (this->sampling_fragment_shader).m_gl = (Functions *)0x0;
  (this->sampling_fragment_shader).m_shader_stage = 0;
  (this->sampling_fragment_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->sampling_fragment_shader).m_source.field_2;
  (this->sampling_fragment_shader).m_source._M_string_length = 0;
  (this->sampling_fragment_shader).m_source.field_2._M_local_buf[0] = '\0';
  (this->sampling_fragment_shader).m_shader_object_id = 0;
  (this->sampling_geometry_shader).m_gl = (Functions *)0x0;
  (this->sampling_geometry_shader).m_shader_stage = 0;
  (this->sampling_geometry_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->sampling_geometry_shader).m_source.field_2;
  (this->sampling_geometry_shader).m_source._M_string_length = 0;
  (this->sampling_geometry_shader).m_source.field_2._M_local_buf[0] = '\0';
  (this->sampling_geometry_shader).m_shader_object_id = 0;
  (this->sampling_tesselation_control_shader).m_gl = (Functions *)0x0;
  (this->sampling_tesselation_control_shader).m_shader_stage = 0;
  (this->sampling_tesselation_control_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->sampling_tesselation_control_shader).m_source.field_2;
  (this->sampling_tesselation_control_shader).m_source._M_string_length = 0;
  (this->sampling_tesselation_control_shader).m_source.field_2._M_local_buf[0] = '\0';
  (this->sampling_tesselation_control_shader).m_shader_object_id = 0;
  (this->sampling_tesselation_evaluation_shader).m_gl = (Functions *)0x0;
  (this->sampling_tesselation_evaluation_shader).m_shader_stage = 0;
  (this->sampling_tesselation_evaluation_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->sampling_tesselation_evaluation_shader).m_source.field_2;
  (this->sampling_tesselation_evaluation_shader).m_source._M_string_length = 0;
  (this->sampling_tesselation_evaluation_shader).m_source.field_2._M_local_buf[0] = '\0';
  (this->sampling_tesselation_evaluation_shader).m_shader_object_id = 0;
  (this->sampling_vertex_shader).m_gl = (Functions *)0x0;
  (this->sampling_vertex_shader).m_shader_stage = 0;
  (this->sampling_vertex_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->sampling_vertex_shader).m_source.field_2;
  (this->sampling_vertex_shader).m_source._M_string_length = 0;
  (this->sampling_vertex_shader).m_source.field_2._M_local_buf[0] = '\0';
  (this->sampling_vertex_shader).m_shader_object_id = 0;
  this->m_sampling_function = Texture;
  return;
}

Assistant:

shaderCollectionForSamplingRoutine() : m_sampling_function(Texture)
		{
		}